

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode.cpp
# Opt level: O0

vector<unsigned_int,_std::allocator<unsigned_int>_> *
unicode_cpts_normalize_nfd(vector<unsigned_int,_std::allocator<unsigned_int>_> *cpts)

{
  size_type sVar1;
  const_reference pvVar2;
  const_iterator prVar3;
  const_iterator prVar4;
  range_nfd *prVar5;
  reference pvVar6;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_RSI;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_RDI;
  range_nfd *it;
  uint32_t cpt;
  size_t i;
  anon_class_1_0_00000001_for__M_comp comp;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *result;
  uint32_t in_stack_ffffffffffffff70;
  uint32_t in_stack_ffffffffffffff74;
  allocator_type *in_stack_ffffffffffffff80;
  size_type in_stack_ffffffffffffff88;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_ffffffffffffff90;
  ulong uVar7;
  value_type local_34;
  ulong local_30;
  undefined1 local_12;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_10;
  
  local_12 = 0;
  local_10 = in_RSI;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(in_RSI);
  std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)0x559c60);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
  std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)0x559c83);
  local_30 = 0;
  while (uVar7 = local_30,
        sVar1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(local_10),
        uVar7 < sVar1) {
    pvVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](local_10,local_30)
    ;
    local_34 = *pvVar2;
    prVar3 = std::initializer_list<range_nfd>::begin(&unicode_ranges_nfd);
    prVar4 = std::initializer_list<range_nfd>::end
                       ((initializer_list<range_nfd> *)
                        CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
    prVar5 = std::
             upper_bound<range_nfd_const*,unsigned_int,unicode_cpts_normalize_nfd(std::vector<unsigned_int,std::allocator<unsigned_int>>const&)::__0>
                       (prVar3,prVar4,&local_34);
    in_stack_ffffffffffffff70 = local_34;
    if ((prVar5[-1].first <= local_34) && (local_34 <= prVar5[-1].last)) {
      in_stack_ffffffffffffff70 = prVar5[-1].nfd;
    }
    in_stack_ffffffffffffff74 = in_stack_ffffffffffffff70;
    pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](in_RDI,local_30);
    *pvVar6 = in_stack_ffffffffffffff70;
    local_30 = local_30 + 1;
  }
  return in_RDI;
}

Assistant:

std::vector<uint32_t> unicode_cpts_normalize_nfd(const std::vector<uint32_t> & cpts) {
    auto comp = [] (const uint32_t cpt, const range_nfd & range) {
        return cpt < range.first;
    };
    std::vector<uint32_t> result(cpts.size());
    for (size_t i = 0; i < cpts.size(); ++i) {
        const uint32_t cpt = cpts[i];
        auto it = std::upper_bound(unicode_ranges_nfd.begin(), unicode_ranges_nfd.end(), cpt, comp) - 1;
        result[i] = (it->first <= cpt && cpt <= it->last) ? it->nfd : cpt;
    }
    return result;
}